

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int uv_listen(uv_stream_t *stream,int backlog,uv_connection_cb cb)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  if (stream->type == UV_NAMED_PIPE) {
    iVar3 = uv_pipe_listen((uv_pipe_t *)stream,backlog,cb);
  }
  else {
    if (stream->type != UV_TCP) {
      return -0x16;
    }
    iVar3 = uv_tcp_listen((uv_tcp_t *)stream,backlog,cb);
  }
  if (iVar3 == 0) {
    uVar2 = stream->flags;
    iVar3 = 0;
    if (((uVar2 >> 0xe & 1) == 0) && (stream->flags = uVar2 | 0x4000, (uVar2 >> 0xd & 1) != 0)) {
      puVar1 = &stream->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  return iVar3;
}

Assistant:

int uv_listen(uv_stream_t* stream, int backlog, uv_connection_cb cb) {
  int err;

  switch (stream->type) {
  case UV_TCP:
    err = uv_tcp_listen((uv_tcp_t*)stream, backlog, cb);
    break;

  case UV_NAMED_PIPE:
    err = uv_pipe_listen((uv_pipe_t*)stream, backlog, cb);
    break;

  default:
    err = -EINVAL;
  }

  if (err == 0)
    uv__handle_start(stream);

  return err;
}